

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

string * __thiscall
QPDF::compute_encryption_key_from_password
          (string *__return_storage_ptr__,QPDF *this,string *password,EncryptionData *data)

{
  int iVar1;
  int iVar2;
  int iterations;
  type ii;
  int key_len;
  MD5 md5;
  Digest digest;
  char pbytes [4];
  MD5 MStack_58;
  string local_48;
  undefined4 local_24;
  
  MD5::MD5(&MStack_58,(uchar *)this,(size_t)password,(uchar *)data);
  pad_or_truncate_password_V4
            (&local_48,
             (string *)
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl);
  MD5::encodeDataIncrementally
            (&MStack_58,
             (char *)CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_),0x20)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  MD5::encodeDataIncrementally(&MStack_58,(char *)(password->field_2)._M_allocated_capacity,0x20);
  local_24 = *(undefined4 *)((long)&password->_M_string_length + 4);
  MD5::encodeDataIncrementally(&MStack_58,(char *)&local_24,4);
  MD5::encodeDataIncrementally
            (&MStack_58,(char *)password[5].field_2._M_allocated_capacity,
             *(size_t *)((long)&password[5].field_2 + 8));
  iVar2 = *(int *)((long)&(password->_M_dataplus)._M_p + 4);
  if ((3 < iVar2) && (password[6].field_2._M_local_buf[0] == '\0')) {
    local_48._M_dataplus._M_p._0_4_ = 0xffffffff;
    MD5::encodeDataIncrementally(&MStack_58,(char *)&local_48,4);
    iVar2 = *(int *)((long)&(password->_M_dataplus)._M_p + 4);
  }
  iVar1 = (int)password->_M_string_length;
  key_len = 0x10;
  if (iVar1 < 0x10) {
    key_len = iVar1;
  }
  iterations = 0x32;
  if (iVar2 < 3) {
    iterations = 0;
  }
  iterate_md5_digest(&MStack_58,(Digest *)&local_48,iterations,key_len);
  if (iVar1 < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(key_len);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_48,
             (long)&local_48._M_dataplus._M_p + (long)key_len);
  if (MStack_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (MStack_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_encryption_key_from_password(std::string const& password, EncryptionData const& data)
{
    // Algorithm 3.2 from the PDF 1.7 Reference Manual

    // This code does not properly handle Unicode passwords. Passwords are supposed to be converted
    // from OS codepage characters to PDFDocEncoding.  Unicode passwords are supposed to be
    // converted to OS codepage before converting to PDFDocEncoding.  We instead require the
    // password to be presented in its final form.

    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    md5.encodeDataIncrementally(data.getO().c_str(), key_bytes);
    char pbytes[4];
    int P = data.getP();
    pbytes[0] = static_cast<char>(P & 0xff);
    pbytes[1] = static_cast<char>((P >> 8) & 0xff);
    pbytes[2] = static_cast<char>((P >> 16) & 0xff);
    pbytes[3] = static_cast<char>((P >> 24) & 0xff);
    md5.encodeDataIncrementally(pbytes, 4);
    md5.encodeDataIncrementally(data.getId1().c_str(), data.getId1().length());
    if ((data.getR() >= 4) && (!data.getEncryptMetadata())) {
        char bytes[4];
        memset(bytes, 0xff, 4);
        md5.encodeDataIncrementally(bytes, 4);
    }
    MD5::Digest digest;
    int key_len = std::min(toI(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    return {reinterpret_cast<char*>(digest), toS(key_len)};
}